

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O3

bool vkt::pipeline::multisample::checkForErrorRS
               (VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS,deUint32 errorCompNdx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int local_40 [4];
  
  uVar1 = (imageRSInfo->extent).depth;
  uVar2 = 0;
  if (uVar1 != 0) {
    uVar4 = (imageRSInfo->extent).height;
    uVar3 = uVar4;
    do {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar1 = (imageRSInfo->extent).width;
        uVar3 = 0;
        do {
          bVar5 = uVar1 != 0;
          uVar1 = 0;
          if (bVar5) {
            uVar4 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_40,(int)dataRS,uVar4,uVar3);
              if (local_40[(int)errorCompNdx] != 0) {
                uVar2 = 1;
                goto LAB_004b7abb;
              }
              uVar4 = uVar4 + 1;
              uVar1 = (imageRSInfo->extent).width;
            } while (uVar4 < uVar1);
            uVar4 = (imageRSInfo->extent).height;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < uVar4);
        uVar1 = (imageRSInfo->extent).depth;
        uVar3 = uVar4;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
    uVar2 = 0;
  }
LAB_004b7abb:
  return SUB41(uVar2,0);
}

Assistant:

bool checkForErrorRS (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS, const deUint32 errorCompNdx)
{
	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const deUint32 errorComponent = dataRS.getPixelUint(x, y, z)[errorCompNdx];

		if (errorComponent > 0)
			return true;
	}

	return false;
}